

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmOutputConverter.cxx
# Opt level: O3

bool cmOutputConverter::ContainedInDirectory
               (string *param_1,string *remote_path,cmStateDirectory *directory)

{
  bool bVar1;
  bool bVar2;
  char *pcVar3;
  string relativePathTopSource;
  string relativePathTopBinary;
  allocator local_61;
  long *local_60 [2];
  long local_50 [2];
  long *local_40 [2];
  long local_30 [2];
  
  pcVar3 = cmStateDirectory::GetRelativePathTopBinary(directory);
  std::__cxx11::string::string((string *)local_40,pcVar3,(allocator *)local_60);
  pcVar3 = cmStateDirectory::GetRelativePathTopSource(directory);
  std::__cxx11::string::string((string *)local_60,pcVar3,&local_61);
  bVar1 = cmOutputConverterNotAbove((param_1->_M_dataplus)._M_p,(char *)local_40[0]);
  if (bVar1) {
    bVar1 = cmOutputConverterNotAbove((remote_path->_M_dataplus)._M_p,(char *)local_40[0]);
  }
  else {
    bVar1 = false;
  }
  bVar2 = cmOutputConverterNotAbove((param_1->_M_dataplus)._M_p,(char *)local_60[0]);
  if (bVar2) {
    bVar2 = cmOutputConverterNotAbove((remote_path->_M_dataplus)._M_p,(char *)local_60[0]);
  }
  else {
    bVar2 = false;
  }
  if (local_60[0] != local_50) {
    operator_delete(local_60[0],local_50[0] + 1);
  }
  if (local_40[0] != local_30) {
    operator_delete(local_40[0],local_30[0] + 1);
  }
  return (bool)(bVar1 | bVar2);
}

Assistant:

bool cmOutputConverter::ContainedInDirectory(std::string const& local_path,
                                             std::string const& remote_path,
                                             cmStateDirectory const& directory)
{
  const std::string relativePathTopBinary =
    directory.GetRelativePathTopBinary();
  const std::string relativePathTopSource =
    directory.GetRelativePathTopSource();

  const bool bothInBinary =
    cmOutputConverterNotAbove(local_path.c_str(),
                              relativePathTopBinary.c_str()) &&
    cmOutputConverterNotAbove(remote_path.c_str(),
                              relativePathTopBinary.c_str());

  const bool bothInSource =
    cmOutputConverterNotAbove(local_path.c_str(),
                              relativePathTopSource.c_str()) &&
    cmOutputConverterNotAbove(remote_path.c_str(),
                              relativePathTopSource.c_str());

  return bothInSource || bothInBinary;
}